

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env_posix.cc
# Opt level: O2

Status __thiscall leveldb::anon_unknown_1::PosixEnv::GetTestDirectory(PosixEnv *this,string *result)

{
  long lVar1;
  __uid_t _Var2;
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  long in_FS_OFFSET;
  Status local_a0;
  char buf [100];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __s = getenv("TEST_TMPDIR");
  if ((__s == (char *)0x0) || (*__s == '\0')) {
    _Var2 = geteuid();
    __s = buf;
    snprintf(__s,100,"/tmp/leveldbtest-%d",(ulong)_Var2);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
            (in_RDX,__s);
  (**(code **)((result->_M_dataplus)._M_p + 0x48))(&local_a0,result);
  Status::~Status(&local_a0);
  (this->super_Env)._vptr_Env = (_func_int **)0x0;
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (Status)(char *)this;
}

Assistant:

Status GetTestDirectory(std::string* result) override {
    const char* env = std::getenv("TEST_TMPDIR");
    if (env && env[0] != '\0') {
      *result = env;
    } else {
      char buf[100];
      std::snprintf(buf, sizeof(buf), "/tmp/leveldbtest-%d",
                    static_cast<int>(::geteuid()));
      *result = buf;
    }

    // The CreateDir status is ignored because the directory may already exist.
    CreateDir(*result);

    return Status::OK();
  }